

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

Qiniu_Json * Qiniu_Json_GetObjectItem(Qiniu_Json *self,char *key,Qiniu_Json *defval)

{
  cJSON *pcVar1;
  Qiniu_Json *sub;
  Qiniu_Json *defval_local;
  char *key_local;
  Qiniu_Json *self_local;
  
  self_local = defval;
  if ((self != (Qiniu_Json *)0x0) &&
     (pcVar1 = cJSON_GetObjectItem(self,key), pcVar1 != (cJSON *)0x0)) {
    self_local = pcVar1;
  }
  return self_local;
}

Assistant:

Qiniu_Json *Qiniu_Json_GetObjectItem(Qiniu_Json *self, const char *key, Qiniu_Json *defval)
{
    Qiniu_Json *sub;
    if (self == NULL)
    {
        return defval;
    }
    sub = cJSON_GetObjectItem(self, key);
    if (sub != NULL)
    {
        return sub;
    }
    else
    {
        return defval;
    }
}